

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::Migrate
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aDstAddr,
          string *aDesignatedNetwork)

{
  string *aDesignatedNetwork_local;
  string *aDstAddr_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::Migrate(const std::string &aDstAddr, const std::string &aDesignatedNetwork)
{
    UNUSED(aDstAddr);
    UNUSED(aDesignatedNetwork);
    return Error{};
}